

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unroller.cpp
# Opt level: O0

void __thiscall
spvtools::opt::anon_unknown_0::LoopUnrollerUtilsImpl::Unroll
          (LoopUnrollerUtilsImpl *this,Loop *loop,size_t factor)

{
  Instruction *induction;
  BasicBlock *latch_block;
  ulong local_158;
  size_t i;
  undefined1 local_38 [8];
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> inductions;
  size_t factor_local;
  Loop *loop_local;
  LoopUnrollerUtilsImpl *this_local;
  
  inductions.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)factor;
  MarkLoopControlAsDontUnroll(this,loop);
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::vector
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             local_38);
  Loop::GetInductionVariables
            (loop,(vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                   *)local_38);
  induction = this->loop_induction_variable_;
  latch_block = Loop::GetLatchBlock(loop);
  LoopUnrollState::LoopUnrollState
            ((LoopUnrollState *)&i,induction,latch_block,this->loop_condition_block_,
             (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             local_38);
  LoopUnrollState::operator=(&this->state_,(LoopUnrollState *)&i);
  LoopUnrollState::~LoopUnrollState((LoopUnrollState *)&i);
  for (local_158 = 0;
      local_158 <
      (long)inductions.
            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage - 1U; local_158 = local_158 + 1) {
    CopyBody(this,loop,true);
  }
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::~vector
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             local_38);
  return;
}

Assistant:

void LoopUnrollerUtilsImpl::Unroll(Loop* loop, size_t factor) {
  // If we unroll a loop partially it will not be safe to unroll it further.
  // This is due to the current method of calculating the number of loop
  // iterations.
  MarkLoopControlAsDontUnroll(loop);

  std::vector<Instruction*> inductions;
  loop->GetInductionVariables(inductions);
  state_ = LoopUnrollState{loop_induction_variable_, loop->GetLatchBlock(),
                           loop_condition_block_, std::move(inductions)};
  for (size_t i = 0; i < factor - 1; ++i) {
    CopyBody(loop, true);
  }
}